

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_16x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  int8_t *piVar20;
  int16_t *piVar21;
  uint uVar22;
  undefined7 in_register_00000009;
  long lVar23;
  undefined8 *puVar24;
  int32_t *piVar25;
  ulong uVar26;
  long lVar27;
  undefined8 *puVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined1 auVar32 [12];
  undefined1 auVar35 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined4 uVar93;
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined4 uVar127;
  undefined1 auVar129 [12];
  undefined1 auVar130 [12];
  undefined1 auVar131 [12];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  __m128i buf0 [32];
  __m128i buf1 [64];
  code *local_648 [2];
  undefined8 local_638 [2];
  undefined2 local_628;
  undefined2 uStack_626;
  undefined2 uStack_624;
  undefined2 uStack_622;
  undefined2 uStack_620;
  undefined2 uStack_61e;
  undefined2 uStack_61c;
  undefined2 uStack_61a;
  undefined1 local_618 [16];
  undefined2 local_608;
  undefined2 uStack_606;
  undefined2 uStack_604;
  undefined2 uStack_602;
  undefined2 uStack_600;
  undefined2 uStack_5fe;
  undefined2 uStack_5fc;
  undefined2 uStack_5fa;
  undefined1 local_5f8 [16];
  undefined2 local_5e8;
  undefined2 uStack_5e6;
  undefined2 uStack_5e4;
  undefined2 uStack_5e2;
  undefined2 uStack_5e0;
  undefined2 uStack_5de;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined1 local_5d8 [16];
  undefined2 local_5c8;
  undefined2 uStack_5c6;
  undefined2 uStack_5c4;
  undefined2 uStack_5c2;
  undefined2 uStack_5c0;
  undefined2 uStack_5be;
  undefined2 uStack_5bc;
  undefined2 uStack_5ba;
  undefined1 local_5b8 [16];
  undefined2 local_5a8;
  undefined2 uStack_5a6;
  undefined2 uStack_5a4;
  undefined2 uStack_5a2;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined1 local_598 [16];
  undefined2 local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined1 local_578 [16];
  undefined2 local_568;
  undefined2 uStack_566;
  undefined2 uStack_564;
  undefined2 uStack_562;
  undefined2 uStack_560;
  undefined2 uStack_55e;
  undefined2 uStack_55c;
  undefined2 uStack_55a;
  undefined1 local_558 [16];
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  undefined1 local_538 [16];
  undefined2 local_528;
  undefined2 uStack_526;
  undefined2 uStack_524;
  undefined2 uStack_522;
  undefined2 uStack_520;
  undefined2 uStack_51e;
  undefined2 uStack_51c;
  undefined2 uStack_51a;
  undefined1 local_518 [16];
  undefined2 local_508;
  undefined2 uStack_506;
  undefined2 uStack_504;
  undefined2 uStack_502;
  undefined2 uStack_500;
  undefined2 uStack_4fe;
  undefined2 uStack_4fc;
  undefined2 uStack_4fa;
  undefined1 local_4f8 [16];
  undefined2 local_4e8;
  undefined2 uStack_4e6;
  undefined2 uStack_4e4;
  undefined2 uStack_4e2;
  undefined2 uStack_4e0;
  undefined2 uStack_4de;
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined1 local_4d8 [16];
  undefined2 local_4c8;
  undefined2 uStack_4c6;
  undefined2 uStack_4c4;
  undefined2 uStack_4c2;
  undefined2 uStack_4c0;
  undefined2 uStack_4be;
  undefined2 uStack_4bc;
  undefined2 uStack_4ba;
  undefined1 local_4b8 [16];
  undefined2 local_4a8;
  undefined2 uStack_4a6;
  undefined2 uStack_4a4;
  undefined2 uStack_4a2;
  undefined2 uStack_4a0;
  undefined2 uStack_49e;
  undefined2 uStack_49c;
  undefined2 uStack_49a;
  undefined1 local_498 [16];
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  undefined1 local_478 [16];
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined1 local_458 [16];
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined8 local_438 [4];
  undefined8 auStack_418 [4];
  undefined8 uStack_3f8;
  undefined8 auStack_3f0 [3];
  undefined8 auStack_3d8 [20];
  undefined8 local_338 [4];
  undefined8 auStack_318 [4];
  undefined8 uStack_2f8;
  undefined8 auStack_2f0 [3];
  undefined8 auStack_2d8 [20];
  undefined8 auStack_238 [4];
  undefined8 auStack_218 [4];
  undefined8 uStack_1f8;
  undefined8 auStack_1f0 [3];
  undefined8 auStack_1d8 [20];
  undefined8 auStack_138 [4];
  undefined1 auStack_118 [16];
  undefined8 auStack_108 [4];
  undefined8 auStack_e8 [2];
  undefined1 auStack_d8 [16];
  undefined8 auStack_c8 [19];
  undefined1 auVar31 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar43 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [12];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [12];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar151 [16];
  
  piVar20 = av1_fwd_txfm_shift_ls[9];
  if ((0xe01UL >> ((ulong)tx_type & 0x3f) & 1) != 0) {
    uVar26 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
    local_648[0] = *(code **)((long)col_txfm8x32_arr + uVar26);
    local_648[1] = *(code **)((long)row_txfm8x16_arr + uVar26);
    lVar27 = 0;
    do {
      if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar23 = 0x200;
        piVar21 = input;
        do {
          uVar3 = *(undefined8 *)(piVar21 + 4);
          *(undefined8 *)((long)local_648 + lVar23) = *(undefined8 *)piVar21;
          *(undefined8 *)((long)local_648 + lVar23 + 8) = uVar3;
          piVar21 = piVar21 + stride;
          lVar23 = lVar23 + -0x10;
        } while (lVar23 != 0);
      }
      else {
        lVar23 = 0;
        piVar21 = input;
        do {
          uVar3 = *(undefined8 *)(piVar21 + 4);
          *(undefined8 *)((long)local_638 + lVar23) = *(undefined8 *)piVar21;
          *(undefined8 *)((long)local_638 + lVar23 + 8) = uVar3;
          lVar23 = lVar23 + 0x10;
          piVar21 = piVar21 + stride;
        } while (lVar23 != 0x200);
      }
      bVar2 = *piVar20;
      uVar22 = (uint)(char)bVar2;
      if ((int)uVar22 < 0) {
        auVar35 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar35 = pshuflw(auVar35,auVar35,0);
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        lVar23 = 0;
        do {
          auVar57 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar23),auVar35);
          auVar57 = psraw(auVar57,ZEXT416(-uVar22));
          *(undefined1 (*) [16])((long)local_638 + lVar23) = auVar57;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x200);
      }
      else if (bVar2 != 0) {
        lVar23 = 0;
        do {
          auVar35 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar23),ZEXT416(uVar22));
          *(undefined1 (*) [16])((long)local_638 + lVar23) = auVar35;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x200);
      }
      (*local_648[0])(local_638,local_638,0xc);
      bVar2 = piVar20[1];
      uVar22 = (uint)(char)bVar2;
      if ((int)uVar22 < 0) {
        auVar35 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar35 = pshuflw(auVar35,auVar35,0);
        auVar57._0_4_ = auVar35._0_4_;
        auVar57._4_4_ = auVar57._0_4_;
        auVar57._8_4_ = auVar57._0_4_;
        auVar57._12_4_ = auVar57._0_4_;
        lVar23 = 0;
        do {
          auVar35 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar23),auVar57);
          auVar35 = psraw(auVar35,ZEXT416(-uVar22));
          *(undefined1 (*) [16])((long)local_638 + lVar23) = auVar35;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x200);
      }
      else if (bVar2 != 0) {
        lVar23 = 0;
        do {
          auVar35 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar23),ZEXT416(uVar22));
          *(undefined1 (*) [16])((long)local_638 + lVar23) = auVar35;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x200);
      }
      lVar23 = lVar27 * 0x80;
      auVar61._0_12_ = local_638._0_12_;
      auVar61._12_2_ = local_638[0]._6_2_;
      auVar61._14_2_ = uStack_622;
      auVar60._12_4_ = auVar61._12_4_;
      auVar60._0_10_ = local_638._0_10_;
      auVar60._10_2_ = uStack_624;
      auVar59._10_6_ = auVar60._10_6_;
      auVar59._0_8_ = local_638[0];
      auVar59._8_2_ = local_638[0]._4_2_;
      auVar4._4_8_ = auVar59._8_8_;
      auVar4._2_2_ = uStack_626;
      auVar4._0_2_ = local_638[0]._2_2_;
      auVar58._0_4_ = CONCAT22(local_628,(short)local_638[0]);
      auVar58._4_12_ = auVar4;
      auVar113._0_12_ = local_618._0_12_;
      auVar113._12_2_ = local_618._6_2_;
      auVar113._14_2_ = uStack_602;
      auVar112._12_4_ = auVar113._12_4_;
      auVar112._0_10_ = local_618._0_10_;
      auVar112._10_2_ = uStack_604;
      auVar111._10_6_ = auVar112._10_6_;
      auVar111._0_8_ = local_618._0_8_;
      auVar111._8_2_ = local_618._4_2_;
      auVar5._4_8_ = auVar111._8_8_;
      auVar5._2_2_ = uStack_606;
      auVar5._0_2_ = local_618._2_2_;
      auVar79._0_12_ = local_5f8._0_12_;
      auVar79._12_2_ = local_5f8._6_2_;
      auVar79._14_2_ = uStack_5e2;
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._0_10_ = local_5f8._0_10_;
      auVar78._10_2_ = uStack_5e4;
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._0_8_ = local_5f8._0_8_;
      auVar77._8_2_ = local_5f8._4_2_;
      auVar6._4_8_ = auVar77._8_8_;
      auVar6._2_2_ = uStack_5e6;
      auVar6._0_2_ = local_5f8._2_2_;
      auVar76._0_4_ = CONCAT22(local_5e8,local_5f8._0_2_);
      auVar76._4_12_ = auVar6;
      auVar142._0_12_ = local_5d8._0_12_;
      auVar142._12_2_ = local_5d8._6_2_;
      auVar142._14_2_ = uStack_5c2;
      auVar141._12_4_ = auVar142._12_4_;
      auVar141._0_10_ = local_5d8._0_10_;
      auVar141._10_2_ = uStack_5c4;
      auVar140._10_6_ = auVar141._10_6_;
      auVar140._0_8_ = local_5d8._0_8_;
      auVar140._8_2_ = local_5d8._4_2_;
      auVar7._4_8_ = auVar140._8_8_;
      auVar7._2_2_ = uStack_5c6;
      auVar7._0_2_ = local_5d8._2_2_;
      uVar30 = CONCAT22(uStack_620,(short)local_638[1]);
      auVar31._0_8_ = CONCAT26(uStack_61e,CONCAT24(local_638[1]._2_2_,uVar30));
      auVar31._8_2_ = local_638[1]._4_2_;
      auVar31._10_2_ = uStack_61c;
      auVar39._12_2_ = local_638[1]._6_2_;
      auVar39._0_12_ = auVar31;
      auVar39._14_2_ = uStack_61a;
      uVar93 = CONCAT22(uStack_600,local_618._8_2_);
      auVar94._0_8_ = CONCAT26(uStack_5fe,CONCAT24(local_618._10_2_,uVar93));
      auVar94._8_2_ = local_618._12_2_;
      auVar94._10_2_ = uStack_5fc;
      auVar98._12_2_ = local_618._14_2_;
      auVar98._0_12_ = auVar94;
      auVar98._14_2_ = uStack_5fa;
      uVar42 = CONCAT22(uStack_5e0,local_5f8._8_2_);
      auVar43._0_8_ = CONCAT26(uStack_5de,CONCAT24(local_5f8._10_2_,uVar42));
      auVar43._8_2_ = local_5f8._12_2_;
      auVar43._10_2_ = uStack_5dc;
      auVar47._12_2_ = local_5f8._14_2_;
      auVar47._0_12_ = auVar43;
      auVar47._14_2_ = uStack_5da;
      uVar127 = CONCAT22(uStack_5c0,local_5d8._8_2_);
      auVar128._0_8_ = CONCAT26(uStack_5be,CONCAT24(local_5d8._10_2_,uVar127));
      auVar128._8_2_ = local_5d8._12_2_;
      auVar128._10_2_ = uStack_5bc;
      auVar132._12_2_ = local_5d8._14_2_;
      auVar132._0_12_ = auVar128;
      auVar132._14_2_ = uStack_5ba;
      auVar103._0_8_ = auVar58._0_8_;
      auVar103._8_4_ = auVar4._0_4_;
      auVar103._12_4_ = auVar5._0_4_;
      auVar107._0_8_ = auVar76._0_8_;
      auVar107._8_4_ = auVar6._0_4_;
      auVar107._12_4_ = auVar7._0_4_;
      auVar123._8_4_ = (int)((ulong)auVar31._0_8_ >> 0x20);
      auVar123._0_8_ = auVar31._0_8_;
      auVar123._12_4_ = (int)((ulong)auVar94._0_8_ >> 0x20);
      auVar136._8_4_ = (int)((ulong)auVar43._0_8_ >> 0x20);
      auVar136._0_8_ = auVar43._0_8_;
      auVar136._12_4_ = (int)((ulong)auVar128._0_8_ >> 0x20);
      local_438[lVar27 * 0x10] = CONCAT44(CONCAT22(local_608,local_618._0_2_),auVar58._0_4_);
      local_438[lVar27 * 0x10 + 1] = CONCAT44(CONCAT22(local_5c8,local_5d8._0_2_),auVar76._0_4_);
      local_438[lVar27 * 0x10 + 2] = auVar103._8_8_;
      auStack_418[lVar27 * 0x10 + -1] = auVar107._8_8_;
      *(int *)(auStack_418 + lVar27 * 0x10) = auVar59._8_4_;
      *(int *)((long)auStack_418 + (lVar27 * 0x20 + 1) * 4) = auVar111._8_4_;
      *(int *)(auStack_418 + lVar27 * 0x10 + 1) = auVar77._8_4_;
      *(int *)((long)auStack_418 + (lVar27 * 0x20 + 3) * 4) = auVar140._8_4_;
      *(undefined4 *)(auStack_418 + lVar27 * 0x10 + 3) = auVar60._12_4_;
      *(undefined4 *)((long)auStack_418 + (lVar27 * 0x20 + 7) * 4) = auVar112._12_4_;
      *(undefined4 *)(&uStack_3f8 + lVar27 * 0x10) = auVar78._12_4_;
      *(undefined4 *)((long)auStack_3f0 + lVar23 + -4) = auVar141._12_4_;
      (&uStack_3f8)[lVar27 * 0x10] = CONCAT44(uVar93,uVar30);
      auStack_3f0[lVar27 * 0x10] = CONCAT44(uVar127,uVar42);
      auStack_3f0[lVar27 * 0x10 + 1] = auVar123._8_8_;
      auStack_3d8[lVar27 * 0x10 + -1] = auVar136._8_8_;
      *(int *)(auStack_3d8 + lVar27 * 0x10) = auVar31._8_4_;
      *(int *)((long)auStack_3d8 + (lVar27 * 0x20 + 1) * 4) = auVar94._8_4_;
      *(int *)(auStack_3d8 + lVar27 * 0x10 + 1) = auVar43._8_4_;
      *(int *)((long)auStack_3d8 + (lVar27 * 0x20 + 3) * 4) = auVar128._8_4_;
      *(int *)(auStack_3d8 + lVar27 * 0x10 + 3) = auVar39._12_4_;
      *(int *)((long)auStack_3d8 + (lVar27 * 0x20 + 7) * 4) = auVar98._12_4_;
      *(int *)(auStack_3d8 + lVar27 * 0x10 + 4) = auVar47._12_4_;
      *(int *)((long)auStack_3d8 + (lVar27 * 0x20 + 9) * 4) = auVar132._12_4_;
      auVar65._0_12_ = local_5b8._0_12_;
      auVar65._12_2_ = local_5b8._6_2_;
      auVar65._14_2_ = uStack_5a2;
      auVar64._12_4_ = auVar65._12_4_;
      auVar64._0_10_ = local_5b8._0_10_;
      auVar64._10_2_ = uStack_5a4;
      auVar63._10_6_ = auVar64._10_6_;
      auVar63._0_8_ = local_5b8._0_8_;
      auVar63._8_2_ = local_5b8._4_2_;
      auVar8._4_8_ = auVar63._8_8_;
      auVar8._2_2_ = uStack_5a6;
      auVar8._0_2_ = local_5b8._2_2_;
      auVar62._0_4_ = CONCAT22(local_5a8,local_5b8._0_2_);
      auVar62._4_12_ = auVar8;
      auVar116._0_12_ = local_598._0_12_;
      auVar116._12_2_ = local_598._6_2_;
      auVar116._14_2_ = uStack_582;
      auVar115._12_4_ = auVar116._12_4_;
      auVar115._0_10_ = local_598._0_10_;
      auVar115._10_2_ = uStack_584;
      auVar114._10_6_ = auVar115._10_6_;
      auVar114._0_8_ = local_598._0_8_;
      auVar114._8_2_ = local_598._4_2_;
      auVar9._4_8_ = auVar114._8_8_;
      auVar9._2_2_ = uStack_586;
      auVar9._0_2_ = local_598._2_2_;
      auVar83._0_12_ = local_578._0_12_;
      auVar83._12_2_ = local_578._6_2_;
      auVar83._14_2_ = uStack_562;
      auVar82._12_4_ = auVar83._12_4_;
      auVar82._0_10_ = local_578._0_10_;
      auVar82._10_2_ = uStack_564;
      auVar81._10_6_ = auVar82._10_6_;
      auVar81._0_8_ = local_578._0_8_;
      auVar81._8_2_ = local_578._4_2_;
      auVar10._4_8_ = auVar81._8_8_;
      auVar10._2_2_ = uStack_566;
      auVar10._0_2_ = local_578._2_2_;
      auVar80._0_4_ = CONCAT22(local_568,local_578._0_2_);
      auVar80._4_12_ = auVar10;
      auVar145._0_12_ = local_558._0_12_;
      auVar145._12_2_ = local_558._6_2_;
      auVar145._14_2_ = uStack_542;
      auVar144._12_4_ = auVar145._12_4_;
      auVar144._0_10_ = local_558._0_10_;
      auVar144._10_2_ = uStack_544;
      auVar143._10_6_ = auVar144._10_6_;
      auVar143._0_8_ = local_558._0_8_;
      auVar143._8_2_ = local_558._4_2_;
      auVar11._4_8_ = auVar143._8_8_;
      auVar11._2_2_ = uStack_546;
      auVar11._0_2_ = local_558._2_2_;
      uVar30 = CONCAT22(uStack_5a0,local_5b8._8_2_);
      auVar32._0_8_ = CONCAT26(uStack_59e,CONCAT24(local_5b8._10_2_,uVar30));
      auVar32._8_2_ = local_5b8._12_2_;
      auVar32._10_2_ = uStack_59c;
      auVar56._12_2_ = local_5b8._14_2_;
      auVar56._0_12_ = auVar32;
      auVar56._14_2_ = uStack_59a;
      uVar93 = CONCAT22(uStack_580,local_598._8_2_);
      auVar95._0_8_ = CONCAT26(uStack_57e,CONCAT24(local_598._10_2_,uVar93));
      auVar95._8_2_ = local_598._12_2_;
      auVar95._10_2_ = uStack_57c;
      auVar99._12_2_ = local_598._14_2_;
      auVar99._0_12_ = auVar95;
      auVar99._14_2_ = uStack_57a;
      uVar42 = CONCAT22(uStack_560,local_578._8_2_);
      auVar44._0_8_ = CONCAT26(uStack_55e,CONCAT24(local_578._10_2_,uVar42));
      auVar44._8_2_ = local_578._12_2_;
      auVar44._10_2_ = uStack_55c;
      auVar48._12_2_ = local_578._14_2_;
      auVar48._0_12_ = auVar44;
      auVar48._14_2_ = uStack_55a;
      uVar127 = CONCAT22(uStack_540,local_558._8_2_);
      auVar129._0_8_ = CONCAT26(uStack_53e,CONCAT24(local_558._10_2_,uVar127));
      auVar129._8_2_ = local_558._12_2_;
      auVar129._10_2_ = uStack_53c;
      auVar133._12_2_ = local_558._14_2_;
      auVar133._0_12_ = auVar129;
      auVar133._14_2_ = uStack_53a;
      auVar104._0_8_ = auVar62._0_8_;
      auVar104._8_4_ = auVar8._0_4_;
      auVar104._12_4_ = auVar9._0_4_;
      auVar108._0_8_ = auVar80._0_8_;
      auVar108._8_4_ = auVar10._0_4_;
      auVar108._12_4_ = auVar11._0_4_;
      auVar124._8_4_ = (int)((ulong)auVar32._0_8_ >> 0x20);
      auVar124._0_8_ = auVar32._0_8_;
      auVar124._12_4_ = (int)((ulong)auVar95._0_8_ >> 0x20);
      auVar137._8_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
      auVar137._0_8_ = auVar44._0_8_;
      auVar137._12_4_ = (int)((ulong)auVar129._0_8_ >> 0x20);
      local_338[lVar27 * 0x10] = CONCAT44(CONCAT22(local_588,local_598._0_2_),auVar62._0_4_);
      local_338[lVar27 * 0x10 + 1] = CONCAT44(CONCAT22(local_548,local_558._0_2_),auVar80._0_4_);
      local_338[lVar27 * 0x10 + 2] = auVar104._8_8_;
      auStack_318[lVar27 * 0x10 + -1] = auVar108._8_8_;
      *(int *)(auStack_318 + lVar27 * 0x10) = auVar63._8_4_;
      *(int *)((long)auStack_318 + (lVar27 * 0x20 + 1) * 4) = auVar114._8_4_;
      *(int *)(auStack_318 + lVar27 * 0x10 + 1) = auVar81._8_4_;
      *(int *)((long)auStack_318 + (lVar27 * 0x20 + 3) * 4) = auVar143._8_4_;
      *(undefined4 *)(auStack_318 + lVar27 * 0x10 + 3) = auVar64._12_4_;
      *(undefined4 *)((long)auStack_318 + (lVar27 * 0x20 + 7) * 4) = auVar115._12_4_;
      *(undefined4 *)(&uStack_2f8 + lVar27 * 0x10) = auVar82._12_4_;
      *(undefined4 *)((long)auStack_2f0 + lVar23 + -4) = auVar144._12_4_;
      (&uStack_2f8)[lVar27 * 0x10] = CONCAT44(uVar93,uVar30);
      auStack_2f0[lVar27 * 0x10] = CONCAT44(uVar127,uVar42);
      auStack_2f0[lVar27 * 0x10 + 1] = auVar124._8_8_;
      auStack_2d8[lVar27 * 0x10 + -1] = auVar137._8_8_;
      *(int *)(auStack_2d8 + lVar27 * 0x10) = auVar32._8_4_;
      *(int *)((long)auStack_2d8 + (lVar27 * 0x20 + 1) * 4) = auVar95._8_4_;
      *(int *)(auStack_2d8 + lVar27 * 0x10 + 1) = auVar44._8_4_;
      *(int *)((long)auStack_2d8 + (lVar27 * 0x20 + 3) * 4) = auVar129._8_4_;
      *(int *)(auStack_2d8 + lVar27 * 0x10 + 3) = auVar56._12_4_;
      *(int *)((long)auStack_2d8 + (lVar27 * 0x20 + 7) * 4) = auVar99._12_4_;
      *(int *)(auStack_2d8 + lVar27 * 0x10 + 4) = auVar48._12_4_;
      *(int *)((long)auStack_2d8 + (lVar27 * 0x20 + 9) * 4) = auVar133._12_4_;
      auVar69._0_12_ = local_538._0_12_;
      auVar69._12_2_ = local_538._6_2_;
      auVar69._14_2_ = uStack_522;
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._0_10_ = local_538._0_10_;
      auVar68._10_2_ = uStack_524;
      auVar67._10_6_ = auVar68._10_6_;
      auVar67._0_8_ = local_538._0_8_;
      auVar67._8_2_ = local_538._4_2_;
      auVar12._4_8_ = auVar67._8_8_;
      auVar12._2_2_ = uStack_526;
      auVar12._0_2_ = local_538._2_2_;
      auVar66._0_4_ = CONCAT22(local_528,local_538._0_2_);
      auVar66._4_12_ = auVar12;
      auVar119._0_12_ = local_518._0_12_;
      auVar119._12_2_ = local_518._6_2_;
      auVar119._14_2_ = uStack_502;
      auVar118._12_4_ = auVar119._12_4_;
      auVar118._0_10_ = local_518._0_10_;
      auVar118._10_2_ = uStack_504;
      auVar117._10_6_ = auVar118._10_6_;
      auVar117._0_8_ = local_518._0_8_;
      auVar117._8_2_ = local_518._4_2_;
      auVar13._4_8_ = auVar117._8_8_;
      auVar13._2_2_ = uStack_506;
      auVar13._0_2_ = local_518._2_2_;
      auVar87._0_12_ = local_4f8._0_12_;
      auVar87._12_2_ = local_4f8._6_2_;
      auVar87._14_2_ = uStack_4e2;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_10_ = local_4f8._0_10_;
      auVar86._10_2_ = uStack_4e4;
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._0_8_ = local_4f8._0_8_;
      auVar85._8_2_ = local_4f8._4_2_;
      auVar14._4_8_ = auVar85._8_8_;
      auVar14._2_2_ = uStack_4e6;
      auVar14._0_2_ = local_4f8._2_2_;
      auVar84._0_4_ = CONCAT22(local_4e8,local_4f8._0_2_);
      auVar84._4_12_ = auVar14;
      auVar148._0_12_ = local_4d8._0_12_;
      auVar148._12_2_ = local_4d8._6_2_;
      auVar148._14_2_ = uStack_4c2;
      auVar147._12_4_ = auVar148._12_4_;
      auVar147._0_10_ = local_4d8._0_10_;
      auVar147._10_2_ = uStack_4c4;
      auVar146._10_6_ = auVar147._10_6_;
      auVar146._0_8_ = local_4d8._0_8_;
      auVar146._8_2_ = local_4d8._4_2_;
      auVar15._4_8_ = auVar146._8_8_;
      auVar15._2_2_ = uStack_4c6;
      auVar15._0_2_ = local_4d8._2_2_;
      uVar30 = CONCAT22(uStack_520,local_538._8_2_);
      auVar33._0_8_ = CONCAT26(uStack_51e,CONCAT24(local_538._10_2_,uVar30));
      auVar33._8_2_ = local_538._12_2_;
      auVar33._10_2_ = uStack_51c;
      auVar36._12_2_ = local_538._14_2_;
      auVar36._0_12_ = auVar33;
      auVar36._14_2_ = uStack_51a;
      uVar93 = CONCAT22(uStack_500,local_518._8_2_);
      auVar96._0_8_ = CONCAT26(uStack_4fe,CONCAT24(local_518._10_2_,uVar93));
      auVar96._8_2_ = local_518._12_2_;
      auVar96._10_2_ = uStack_4fc;
      auVar100._12_2_ = local_518._14_2_;
      auVar100._0_12_ = auVar96;
      auVar100._14_2_ = uStack_4fa;
      uVar42 = CONCAT22(uStack_4e0,local_4f8._8_2_);
      auVar45._0_8_ = CONCAT26(uStack_4de,CONCAT24(local_4f8._10_2_,uVar42));
      auVar45._8_2_ = local_4f8._12_2_;
      auVar45._10_2_ = uStack_4dc;
      auVar49._12_2_ = local_4f8._14_2_;
      auVar49._0_12_ = auVar45;
      auVar49._14_2_ = uStack_4da;
      uVar127 = CONCAT22(uStack_4c0,local_4d8._8_2_);
      auVar130._0_8_ = CONCAT26(uStack_4be,CONCAT24(local_4d8._10_2_,uVar127));
      auVar130._8_2_ = local_4d8._12_2_;
      auVar130._10_2_ = uStack_4bc;
      auVar134._12_2_ = local_4d8._14_2_;
      auVar134._0_12_ = auVar130;
      auVar134._14_2_ = uStack_4ba;
      auVar105._0_8_ = auVar66._0_8_;
      auVar105._8_4_ = auVar12._0_4_;
      auVar105._12_4_ = auVar13._0_4_;
      auVar109._0_8_ = auVar84._0_8_;
      auVar109._8_4_ = auVar14._0_4_;
      auVar109._12_4_ = auVar15._0_4_;
      auVar125._8_4_ = (int)((ulong)auVar33._0_8_ >> 0x20);
      auVar125._0_8_ = auVar33._0_8_;
      auVar125._12_4_ = (int)((ulong)auVar96._0_8_ >> 0x20);
      auVar138._8_4_ = (int)((ulong)auVar45._0_8_ >> 0x20);
      auVar138._0_8_ = auVar45._0_8_;
      auVar138._12_4_ = (int)((ulong)auVar130._0_8_ >> 0x20);
      auStack_238[lVar27 * 0x10] = CONCAT44(CONCAT22(local_508,local_518._0_2_),auVar66._0_4_);
      auStack_238[lVar27 * 0x10 + 1] = CONCAT44(CONCAT22(local_4c8,local_4d8._0_2_),auVar84._0_4_);
      auStack_238[lVar27 * 0x10 + 2] = auVar105._8_8_;
      auStack_218[lVar27 * 0x10 + -1] = auVar109._8_8_;
      *(int *)(auStack_218 + lVar27 * 0x10) = auVar67._8_4_;
      *(int *)((long)auStack_218 + (lVar27 * 0x20 + 1) * 4) = auVar117._8_4_;
      *(int *)(auStack_218 + lVar27 * 0x10 + 1) = auVar85._8_4_;
      *(int *)((long)auStack_218 + (lVar27 * 0x20 + 3) * 4) = auVar146._8_4_;
      *(undefined4 *)(auStack_218 + lVar27 * 0x10 + 3) = auVar68._12_4_;
      *(undefined4 *)((long)auStack_218 + (lVar27 * 0x20 + 7) * 4) = auVar118._12_4_;
      *(undefined4 *)(&uStack_1f8 + lVar27 * 0x10) = auVar86._12_4_;
      *(undefined4 *)((long)auStack_1f0 + lVar23 + -4) = auVar147._12_4_;
      (&uStack_1f8)[lVar27 * 0x10] = CONCAT44(uVar93,uVar30);
      auStack_1f0[lVar27 * 0x10] = CONCAT44(uVar127,uVar42);
      auStack_1f0[lVar27 * 0x10 + 1] = auVar125._8_8_;
      auStack_1d8[lVar27 * 0x10 + -1] = auVar138._8_8_;
      *(int *)(auStack_1d8 + lVar27 * 0x10) = auVar33._8_4_;
      *(int *)((long)auStack_1d8 + (lVar27 * 0x20 + 1) * 4) = auVar96._8_4_;
      *(int *)(auStack_1d8 + lVar27 * 0x10 + 1) = auVar45._8_4_;
      *(int *)((long)auStack_1d8 + (lVar27 * 0x20 + 3) * 4) = auVar130._8_4_;
      *(int *)(auStack_1d8 + lVar27 * 0x10 + 3) = auVar36._12_4_;
      *(int *)((long)auStack_1d8 + (lVar27 * 0x20 + 7) * 4) = auVar100._12_4_;
      *(int *)(auStack_1d8 + lVar27 * 0x10 + 4) = auVar49._12_4_;
      *(int *)((long)auStack_1d8 + (lVar27 * 0x20 + 9) * 4) = auVar134._12_4_;
      auVar73._0_12_ = local_4b8._0_12_;
      auVar73._12_2_ = local_4b8._6_2_;
      auVar73._14_2_ = uStack_4a2;
      auVar72._12_4_ = auVar73._12_4_;
      auVar72._0_10_ = local_4b8._0_10_;
      auVar72._10_2_ = uStack_4a4;
      auVar71._10_6_ = auVar72._10_6_;
      auVar71._0_8_ = local_4b8._0_8_;
      auVar71._8_2_ = local_4b8._4_2_;
      auVar16._4_8_ = auVar71._8_8_;
      auVar16._2_2_ = uStack_4a6;
      auVar16._0_2_ = local_4b8._2_2_;
      auVar70._0_4_ = CONCAT22(local_4a8,local_4b8._0_2_);
      auVar70._4_12_ = auVar16;
      auVar122._0_12_ = local_498._0_12_;
      auVar122._12_2_ = local_498._6_2_;
      auVar122._14_2_ = uStack_482;
      auVar121._12_4_ = auVar122._12_4_;
      auVar121._0_10_ = local_498._0_10_;
      auVar121._10_2_ = uStack_484;
      auVar120._10_6_ = auVar121._10_6_;
      auVar120._0_8_ = local_498._0_8_;
      auVar120._8_2_ = local_498._4_2_;
      auVar17._4_8_ = auVar120._8_8_;
      auVar17._2_2_ = uStack_486;
      auVar17._0_2_ = local_498._2_2_;
      auVar91._0_12_ = local_478._0_12_;
      auVar91._12_2_ = local_478._6_2_;
      auVar91._14_2_ = uStack_462;
      auVar90._12_4_ = auVar91._12_4_;
      auVar90._0_10_ = local_478._0_10_;
      auVar90._10_2_ = uStack_464;
      auVar89._10_6_ = auVar90._10_6_;
      auVar89._0_8_ = local_478._0_8_;
      auVar89._8_2_ = local_478._4_2_;
      auVar18._4_8_ = auVar89._8_8_;
      auVar18._2_2_ = uStack_466;
      auVar18._0_2_ = local_478._2_2_;
      auVar88._0_4_ = CONCAT22(local_468,local_478._0_2_);
      auVar88._4_12_ = auVar18;
      auVar151._0_12_ = local_458._0_12_;
      auVar151._12_2_ = local_458._6_2_;
      auVar151._14_2_ = uStack_442;
      auVar150._12_4_ = auVar151._12_4_;
      auVar150._0_10_ = local_458._0_10_;
      auVar150._10_2_ = uStack_444;
      auVar149._10_6_ = auVar150._10_6_;
      auVar149._0_8_ = local_458._0_8_;
      auVar149._8_2_ = local_458._4_2_;
      auVar19._4_8_ = auVar149._8_8_;
      auVar19._2_2_ = uStack_446;
      auVar19._0_2_ = local_458._2_2_;
      uVar30 = CONCAT22(uStack_4a0,local_4b8._8_2_);
      auVar34._0_8_ = CONCAT26(uStack_49e,CONCAT24(local_4b8._10_2_,uVar30));
      auVar34._8_2_ = local_4b8._12_2_;
      auVar34._10_2_ = uStack_49c;
      auVar37._12_2_ = local_4b8._14_2_;
      auVar37._0_12_ = auVar34;
      auVar37._14_2_ = uStack_49a;
      uVar93 = CONCAT22(uStack_480,local_498._8_2_);
      auVar97._0_8_ = CONCAT26(uStack_47e,CONCAT24(local_498._10_2_,uVar93));
      auVar97._8_2_ = local_498._12_2_;
      auVar97._10_2_ = uStack_47c;
      auVar101._12_2_ = local_498._14_2_;
      auVar101._0_12_ = auVar97;
      auVar101._14_2_ = uStack_47a;
      uVar42 = CONCAT22(uStack_460,local_478._8_2_);
      auVar46._0_8_ = CONCAT26(uStack_45e,CONCAT24(local_478._10_2_,uVar42));
      auVar46._8_2_ = local_478._12_2_;
      auVar46._10_2_ = uStack_45c;
      auVar50._12_2_ = local_478._14_2_;
      auVar50._0_12_ = auVar46;
      auVar50._14_2_ = uStack_45a;
      uVar127 = CONCAT22(uStack_440,local_458._8_2_);
      auVar131._0_8_ = CONCAT26(uStack_43e,CONCAT24(local_458._10_2_,uVar127));
      auVar131._8_2_ = local_458._12_2_;
      auVar131._10_2_ = uStack_43c;
      auVar135._12_2_ = local_458._14_2_;
      auVar135._0_12_ = auVar131;
      auVar135._14_2_ = uStack_43a;
      auVar106._0_8_ = auVar70._0_8_;
      auVar106._8_4_ = auVar16._0_4_;
      auVar106._12_4_ = auVar17._0_4_;
      auVar110._0_8_ = auVar88._0_8_;
      auVar110._8_4_ = auVar18._0_4_;
      auVar110._12_4_ = auVar19._0_4_;
      auVar126._8_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
      auVar126._0_8_ = auVar34._0_8_;
      auVar126._12_4_ = (int)((ulong)auVar97._0_8_ >> 0x20);
      auVar139._8_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
      auVar139._0_8_ = auVar46._0_8_;
      auVar139._12_4_ = (int)((ulong)auVar131._0_8_ >> 0x20);
      auVar74._0_8_ = CONCAT44(auVar120._8_4_,auVar71._8_4_);
      auVar74._8_4_ = auVar72._12_4_;
      auVar74._12_4_ = auVar121._12_4_;
      auVar92._0_8_ = CONCAT44(auVar149._8_4_,auVar89._8_4_);
      auVar92._8_4_ = auVar90._12_4_;
      auVar92._12_4_ = auVar150._12_4_;
      auVar38._0_8_ = CONCAT44(auVar97._8_4_,auVar34._8_4_);
      auVar38._8_4_ = auVar37._12_4_;
      auVar38._12_4_ = auVar101._12_4_;
      auVar51._0_8_ = CONCAT44(auVar131._8_4_,auVar46._8_4_);
      auVar51._8_4_ = auVar50._12_4_;
      auVar51._12_4_ = auVar135._12_4_;
      auStack_138[lVar27 * 0x10] = CONCAT44(CONCAT22(local_488,local_498._0_2_),auVar70._0_4_);
      auStack_138[lVar27 * 0x10 + 1] = CONCAT44(CONCAT22(local_448,local_458._0_2_),auVar88._0_4_);
      auStack_138[lVar27 * 0x10 + 2] = auVar106._8_8_;
      *(long *)(auStack_118 + lVar23 + -8) = auVar110._8_8_;
      auVar102._8_8_ = auVar92._0_8_;
      auVar102._0_8_ = auVar74._0_8_;
      *(undefined1 (*) [16])(auStack_118 + lVar23) = auVar102;
      auStack_108[lVar27 * 0x10] = auVar74._8_8_;
      auStack_108[lVar27 * 0x10 + 1] = auVar92._8_8_;
      auStack_108[lVar27 * 0x10 + 2] = CONCAT44(uVar93,uVar30);
      auStack_108[lVar27 * 0x10 + 3] = CONCAT44(uVar127,uVar42);
      *(long *)(auStack_d8 + lVar23 + -0x10) = auVar126._8_8_;
      *(long *)(auStack_d8 + lVar23 + -8) = auVar139._8_8_;
      auVar75._8_8_ = auVar51._0_8_;
      auVar75._0_8_ = auVar38._0_8_;
      *(undefined1 (*) [16])(auStack_d8 + lVar23) = auVar75;
      auStack_c8[lVar27 * 0x10] = auVar38._8_8_;
      auStack_c8[lVar27 * 0x10 + 1] = auVar51._8_8_;
      input = input + 8;
      bVar29 = lVar27 == 0;
      lVar27 = lVar27 + 1;
    } while (bVar29);
    piVar25 = output + 4;
    puVar28 = local_438;
    lVar27 = 0;
    do {
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar23 = 0x100;
        puVar24 = puVar28;
        do {
          uVar3 = puVar24[1];
          *(undefined8 *)((long)local_648 + lVar23) = *puVar24;
          *(undefined8 *)((long)local_648 + lVar23 + 8) = uVar3;
          puVar24 = puVar24 + 2;
          lVar23 = lVar23 + -0x10;
        } while (lVar23 != 0);
        puVar24 = local_638;
      }
      else {
        puVar24 = local_438 + lVar27 * 0x20;
      }
      (*local_648[1])(puVar24,puVar24,0xd);
      auVar57 = _DAT_00ddd490;
      auVar35 = _DAT_00c1e220;
      bVar2 = piVar20[2];
      uVar22 = (uint)(char)bVar2;
      if ((int)uVar22 < 0) {
        auVar39 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar39 = pshuflw(auVar39,auVar39,0);
        auVar40._0_4_ = auVar39._0_4_;
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar40._0_4_;
        auVar40._12_4_ = auVar40._0_4_;
        lVar23 = 0;
        do {
          auVar39 = paddsw(*(undefined1 (*) [16])((long)puVar24 + lVar23),auVar40);
          auVar39 = psraw(auVar39,ZEXT416(-uVar22));
          *(undefined1 (*) [16])((long)puVar24 + lVar23) = auVar39;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x100);
      }
      else if (bVar2 != 0) {
        lVar23 = 0;
        do {
          auVar39 = psllw(*(undefined1 (*) [16])((long)puVar24 + lVar23),ZEXT416(uVar22));
          *(undefined1 (*) [16])((long)puVar24 + lVar23) = auVar39;
          lVar23 = lVar23 + 0x10;
        } while (lVar23 != 0x100);
      }
      lVar23 = 0;
      do {
        auVar39 = *(undefined1 (*) [16])((long)puVar24 + lVar23);
        auVar55._0_12_ = auVar39._0_12_;
        auVar55._12_2_ = auVar39._6_2_;
        auVar55._14_2_ = auVar35._6_2_;
        auVar54._12_4_ = auVar55._12_4_;
        auVar54._0_10_ = auVar39._0_10_;
        auVar54._10_2_ = auVar35._4_2_;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._0_8_ = auVar39._0_8_;
        auVar53._8_2_ = auVar39._4_2_;
        auVar52._8_8_ = auVar53._8_8_;
        auVar52._6_2_ = auVar35._2_2_;
        auVar52._4_2_ = auVar39._2_2_;
        auVar52._0_2_ = auVar39._0_2_;
        auVar52._2_2_ = auVar35._0_2_;
        auVar41._2_2_ = 1;
        auVar41._0_2_ = auVar39._8_2_;
        auVar41._4_2_ = auVar39._10_2_;
        auVar41._6_2_ = 1;
        auVar41._8_2_ = auVar39._12_2_;
        auVar41._10_2_ = 1;
        auVar41._12_2_ = auVar39._14_2_;
        auVar41._14_2_ = 1;
        auVar56 = pmaddwd(auVar52,auVar57);
        auVar39 = pmaddwd(auVar41,auVar57);
        piVar1 = piVar25 + lVar23 * 2 + -4;
        *piVar1 = auVar56._0_4_ >> 0xc;
        piVar1[1] = auVar56._4_4_ >> 0xc;
        piVar1[2] = auVar56._8_4_ >> 0xc;
        piVar1[3] = auVar56._12_4_ >> 0xc;
        piVar1 = piVar25 + lVar23 * 2;
        *piVar1 = auVar39._0_4_ >> 0xc;
        piVar1[1] = auVar39._4_4_ >> 0xc;
        piVar1[2] = auVar39._8_4_ >> 0xc;
        piVar1[3] = auVar39._12_4_ >> 0xc;
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0x100);
      lVar27 = lVar27 + 1;
      puVar28 = puVar28 + 0x20;
      piVar25 = piVar25 + 8;
    } while (lVar27 != 4);
    return;
  }
  av1_fwd_txfm2d_16x32_c(input,output,stride,tx_type,bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x32_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 2; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0 + 0 * 8, buf1 + 0 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 1 * 8, buf1 + 1 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 2 * 8, buf1 + 2 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 3 * 8, buf1 + 3 * width + 8 * i);
    }

    for (int i = 0; i < 4; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_16x32_c(input, output, stride, tx_type, bd);
  }
}